

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void daily_example(void)

{
  allocator local_5a;
  allocator local_59;
  string local_58 [32];
  filename_t local_38;
  shared_ptr<spdlog::logger> daily_logger;
  
  std::__cxx11::string::string((string *)&local_38,"daily_logger",&local_59);
  std::__cxx11::string::string(local_58,"logs/daily.txt",&local_5a);
  spdlog::daily_logger_mt<spdlog::synchronous_factory>
            ((string *)&daily_logger,&local_38,(int)local_58,2,true,0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&daily_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void daily_example()
{
    // Create a daily logger - a new file is created every day on 2:30am.
    auto daily_logger = spdlog::daily_logger_mt("daily_logger", "logs/daily.txt", 2, 30);
}